

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_32f1a0::Db::parseQualifiedType(Db *this)

{
  bool bVar1;
  char *pcVar2;
  Db *local_b8;
  Node *Ty;
  Node *pNStack_a8;
  Qualifiers Quals;
  Node *Child;
  Node *Child_1;
  char *local_90;
  undefined1 local_88 [8];
  SwapAndRestore<const_char_*> SaveLast;
  SwapAndRestore<const_char_*> SaveFirst;
  StringView Proto;
  StringView ProtoSourceName;
  undefined1 local_28 [8];
  StringView Qual;
  Db *this_local;
  
  Qual.Last = (char *)this;
  bVar1 = consumeIf(this,'U');
  if (bVar1) {
    _local_28 = parseBareSourceName(this);
    bVar1 = StringView::empty((StringView *)local_28);
    if (bVar1) {
      this_local = (Db *)0x0;
    }
    else {
      StringView::StringView((StringView *)&ProtoSourceName.Last,"objcproto");
      bVar1 = StringView::startsWith((StringView *)local_28,stack0xffffffffffffffc8);
      if (bVar1) {
        join_0x00000010_0x00000000_ = StringView::dropFront((StringView *)local_28,9);
        StringView::StringView((StringView *)&SaveFirst.ShouldRestore);
        pcVar2 = StringView::begin((StringView *)&Proto.Last);
        SwapAndRestore<const_char_*>::SwapAndRestore
                  ((SwapAndRestore<const_char_*> *)&SaveLast.ShouldRestore,&this->First,pcVar2);
        pcVar2 = StringView::end((StringView *)&Proto.Last);
        SwapAndRestore<const_char_*>::SwapAndRestore
                  ((SwapAndRestore<const_char_*> *)local_88,&this->Last,pcVar2);
        _Child_1 = parseBareSourceName(this);
        SaveFirst._16_8_ = Child_1;
        Proto.First = local_90;
        SwapAndRestore<const_char_*>::~SwapAndRestore((SwapAndRestore<const_char_*> *)local_88);
        SwapAndRestore<const_char_*>::~SwapAndRestore
                  ((SwapAndRestore<const_char_*> *)&SaveLast.ShouldRestore);
        bVar1 = StringView::empty((StringView *)&SaveFirst.ShouldRestore);
        if (bVar1) {
          this_local = (Db *)0x0;
        }
        else {
          Child = parseQualifiedType(this);
          if (Child == (Node *)0x0) {
            this_local = (Db *)0x0;
          }
          else {
            this_local = (Db *)(anonymous_namespace)::Db::
                               make<(anonymous_namespace)::ObjCProtoName,(anonymous_namespace)::Node*&,StringView&>
                                         ((Db *)this,&Child,(StringView *)&SaveFirst.ShouldRestore);
          }
        }
      }
      else {
        pNStack_a8 = parseQualifiedType(this);
        if (pNStack_a8 == (Node *)0x0) {
          this_local = (Db *)0x0;
        }
        else {
          this_local = (Db *)(anonymous_namespace)::Db::
                             make<(anonymous_namespace)::VendorExtQualType,(anonymous_namespace)::Node*&,StringView&>
                                       ((Db *)this,&stack0xffffffffffffff58,(StringView *)local_28);
        }
      }
    }
  }
  else {
    Ty._4_4_ = parseCVQualifiers(this);
    local_b8 = (Db *)parseType(this);
    if (local_b8 == (Db *)0x0) {
      this_local = (Db *)0x0;
    }
    else {
      if (Ty._4_4_ != QualNone) {
        local_b8 = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::QualType,(anonymous_namespace)::Node*&,(anonymous_namespace)::Qualifiers&>
                                   ((Db *)this,(Node **)&local_b8,(Qualifiers *)((long)&Ty + 4));
      }
      this_local = local_b8;
    }
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseQualifiedType() {
  if (consumeIf('U')) {
    StringView Qual = parseBareSourceName();
    if (Qual.empty())
      return nullptr;

    // FIXME parse the optional <template-args> here!

    // extension            ::= U <objc-name> <objc-type>  # objc-type<identifier>
    if (Qual.startsWith("objcproto")) {
      StringView ProtoSourceName = Qual.dropFront(std::strlen("objcproto"));
      StringView Proto;
      {
        SwapAndRestore<const char *> SaveFirst(First, ProtoSourceName.begin()),
                                     SaveLast(Last, ProtoSourceName.end());
        Proto = parseBareSourceName();
      }
      if (Proto.empty())
        return nullptr;
      Node *Child = parseQualifiedType();
      if (Child == nullptr)
        return nullptr;
      return make<ObjCProtoName>(Child, Proto);
    }

    Node *Child = parseQualifiedType();
    if (Child == nullptr)
      return nullptr;
    return make<VendorExtQualType>(Child, Qual);
  }

  Qualifiers Quals = parseCVQualifiers();
  Node *Ty = parseType();
  if (Ty == nullptr)
    return nullptr;
  if (Quals != QualNone)
    Ty = make<QualType>(Ty, Quals);
  return Ty;
}